

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_tidy(_glist *x)

{
  bool bVar1;
  int iVar2;
  void *data;
  bool bVar3;
  int vmove;
  int keep;
  int hit;
  int distance;
  int all;
  int bestdist;
  int besthist;
  int i;
  int *ip;
  int histogram [35];
  int local_40;
  int local_3c;
  int by2;
  int bx2;
  int by1;
  int bx1;
  int ay2;
  int ax2;
  int ay1;
  int ax1;
  t_gobj *y2;
  t_gobj *y;
  _glist *x_local;
  
  if (x->gl_editor == (t_editor *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = x->gl_editor->e_selection == (t_selection *)0x0;
  }
  y = (t_gobj *)x;
  data = canvas_undo_set_move(x,(uint)((bVar3 ^ 0xffU) & 1));
  canvas_undo_add(x,UNDO_MOTION,"{tidy up}",data);
  for (y2 = (t_gobj *)y[3].g_pd; y2 != (t_gobj *)0x0; y2 = y2->g_next) {
    if ((bVar3) || (iVar2 = glist_isselected((_glist *)y,y2), iVar2 != 0)) {
      gobj_getrect(y2,(_glist *)y,&ax2,&ay2,&bx1,&by1);
      for (_ay1 = y[3].g_pd; _ay1 != (t_pd)0x0; _ay1 = (t_pd)_ay1->c_helpname) {
        if ((((bVar3) || (iVar2 = glist_isselected((_glist *)y,(t_gobj *)_ay1), iVar2 != 0)) &&
            (gobj_getrect((t_gobj *)_ay1,(_glist *)y,&bx2,&by2,&local_3c,&local_40),
            by2 <= ay2 + 0x11)) && ((ay2 + -0x11 <= by2 && (bx2 < ax2)))) goto LAB_0016292c;
      }
      for (_ay1 = y[3].g_pd; _ay1 != (t_pd)0x0; _ay1 = (t_pd)_ay1->c_helpname) {
        if (((bVar3) || (iVar2 = glist_isselected((_glist *)y,(t_gobj *)_ay1), iVar2 != 0)) &&
           ((gobj_getrect((t_gobj *)_ay1,(_glist *)y,&bx2,&by2,&local_3c,&local_40),
            by2 <= ay2 + 0x11 && ((ay2 + -0x11 <= by2 && (by2 != ay2)))))) {
          gobj_displace((t_gobj *)_ay1,(_glist *)y,0,ay2 - by2);
        }
      }
    }
LAB_0016292c:
  }
  bestdist = 0x23;
  _besthist = &ip;
  while (bestdist != 0) {
    *(undefined4 *)_besthist = 0;
    _besthist = (int **)((long)_besthist + 4);
    bestdist = bestdist + -1;
  }
  for (y2 = (t_gobj *)y[3].g_pd; y2 != (t_gobj *)0x0; y2 = y2->g_next) {
    if ((bVar3) || (iVar2 = glist_isselected((_glist *)y,y2), iVar2 != 0)) {
      gobj_getrect(y2,(_glist *)y,&ax2,&ay2,&bx1,&by1);
      for (_ay1 = y[3].g_pd; _ay1 != (t_pd)0x0; _ay1 = (t_pd)_ay1->c_helpname) {
        if ((((bVar3) || (iVar2 = glist_isselected((_glist *)y,(t_gobj *)_ay1), iVar2 != 0)) &&
            (gobj_getrect((t_gobj *)_ay1,(_glist *)y,&bx2,&by2,&local_3c,&local_40),
            bx2 <= ax2 + 0x12)) &&
           (((ax2 + -0x12 <= bx2 && (iVar2 = by2 - by1, -1 < iVar2)) && (iVar2 < 0x23)))) {
          histogram[(long)iVar2 + -2] = histogram[(long)iVar2 + -2] + 1;
        }
      }
    }
  }
  all = 0;
  distance = 4;
  _besthist = (int **)histogram;
  for (bestdist = 2; bestdist < 0x21; bestdist = bestdist + 1) {
    iVar2 = *(int *)((long)_besthist + -8) + *(int *)((long)_besthist + -4) * 2 +
            *(int *)_besthist * 3 + *(int *)((long)_besthist + 4) * 2 +
            *(int *)((long)_besthist + 8);
    if (all < iVar2) {
      distance = bestdist;
      all = iVar2;
    }
    _besthist = (int **)((long)_besthist + 4);
  }
  logpost((void *)0x0,3,"tidy: best vertical distance %d",(ulong)(uint)distance);
  y2 = (t_gobj *)y[3].g_pd;
  do {
    if (y2 == (t_gobj *)0x0) {
      canvas_dirty((_glist *)y,1.0);
      return;
    }
    if ((bVar3) || (iVar2 = glist_isselected((_glist *)y,y2), iVar2 != 0)) {
      bVar1 = true;
      gobj_getrect(y2,(_glist *)y,&ax2,&ay2,&bx1,&by1);
      for (_ay1 = y[3].g_pd; _ay1 != (t_pd)0x0; _ay1 = (t_pd)_ay1->c_helpname) {
        if (((((bVar3) || (iVar2 = glist_isselected((_glist *)y,(t_gobj *)_ay1), iVar2 != 0)) &&
             (gobj_getrect((t_gobj *)_ay1,(_glist *)y,&bx2,&by2,&local_3c,&local_40),
             bx2 <= ax2 + 0x12)) && ((ax2 + -0x12 <= bx2 && (local_40 + -10 <= ay2)))) &&
           (ay2 < local_40 + 0x23)) goto LAB_00162d98;
      }
LAB_00162c92:
      if (bVar1) {
        bVar1 = false;
        for (_ay1 = y[3].g_pd; _ay1 != (t_pd)0x0; _ay1 = (t_pd)_ay1->c_helpname) {
          if (((bVar3) || (iVar2 = glist_isselected((_glist *)y,(t_gobj *)_ay1), iVar2 != 0)) &&
             ((gobj_getrect((t_gobj *)_ay1,(_glist *)y,&bx2,&by2,&local_3c,&local_40),
              bx2 <= ax2 + 0x12 && (((ax2 + -0x12 <= bx2 && (ay2 < by2)) && (by2 < by1 + 0x23))))))
          {
            iVar2 = (by1 + distance) - by2;
            gobj_displace((t_gobj *)_ay1,(_glist *)y,ax2 - bx2,iVar2);
            ay2 = by2 + iVar2;
            by1 = local_40 + iVar2;
            bVar1 = true;
            break;
          }
        }
        goto LAB_00162c92;
      }
    }
LAB_00162d98:
    y2 = y2->g_next;
  } while( true );
}

Assistant:

static void canvas_tidy(t_canvas *x)
{
    t_gobj *y, *y2;
    int ax1, ay1, ax2, ay2, bx1, by1, bx2, by2;
    int histogram[NHIST], *ip, i, besthist, bestdist;
        /* if nobody is selected, this means do it to all boxes;
           otherwise just the selection */
    int all = (x->gl_editor ? (x->gl_editor->e_selection == 0) : 1);

    canvas_undo_add(x, UNDO_MOTION, "{tidy up}", canvas_undo_set_move(x, !all));

        /* tidy horizontally */
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE &&
                        bx1 < ax1)
                        goto nothorizhead;
                }

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE
                        && by1 != ay1)
                        gobj_displace(y2, x, 0, ay1-by1);
                }
        nothorizhead: ;
        }
        /* tidy vertically.  First guess the user's favorite vertical spacing */
    for (i = NHIST, ip = histogram; i--; ip++) *ip = 0;
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE)
                    {
                        int distance = by1-ay2;
                        if (distance >= 0 && distance < NHIST)
                            histogram[distance]++;
                    }
                }
        }
    for (i = 2, besthist = 0, bestdist = 4, ip = histogram + 2;
         i < (NHIST-2); i++, ip++)
    {
        int hit = ip[-2] + 2 * ip[-1] + 3 * ip[0] + 2* ip[1] + ip[2];
        if (hit > besthist)
        {
            besthist = hit;
            bestdist = i;
        }
    }
    logpost(NULL, 3, "tidy: best vertical distance %d", bestdist);
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            int keep = 1;
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                        ay1 >= by2 - 10 && ay1 < by2 + NHIST)
                        goto nothead;
                }
            while (keep)
            {
                keep = 0;
                for (y2 = x->gl_list; y2; y2 = y2->g_next)
                    if (all || glist_isselected(x, y2))
                    {
                        gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                        if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                            by1 > ay1 && by1 < ay2 + NHIST)
                        {
                            int vmove = ay2 + bestdist - by1;
                            gobj_displace(y2, x, ax1-bx1, vmove);
                            ay1 = by1 + vmove;
                            ay2 = by2 + vmove;
                            keep = 1;
                            break;
                        }
                    }
            }
        nothead: ;
        }
    canvas_dirty(x, 1);
}